

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

int it_xm_read_sample_data(IT_SAMPLE *sample,uchar roguebytes,DUMBFILE *f)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int *piVar6;
  void *pvVar7;
  int iVar8;
  int32 iVar9;
  int iVar10;
  char *ptr;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  short *psVar14;
  ulong uVar15;
  char cVar16;
  short sVar17;
  byte bVar18;
  short sVar19;
  
  if ((sample->flags & 1) == 0) {
    iVar8 = dumbfile_skip(f,(ulong)roguebytes);
    return iVar8;
  }
  iVar8 = sample->length;
  ptr = (char *)malloc((long)iVar8);
  sample->data = ptr;
  if (ptr == (char *)0x0) {
    return -1;
  }
  if (roguebytes == '\x04') {
    iVar9 = _dumb_it_read_sample_data_adpcm4(sample,f);
    return iVar9 >> 0x1f;
  }
  dumbfile_getnc(ptr,iVar8,f);
  iVar10 = dumbfile_error(f);
  if (iVar10 != 0) {
    return -1;
  }
  piVar6 = (int *)sample->data;
  if ((piVar6[1] == 0x5367674f) &&
     (iVar10 = bcmp((void *)((long)piVar6 + 0x21),"vorbis",7), iVar10 == 0)) {
    bVar18 = sample->flags;
    iVar10 = *piVar6 << ((bVar18 & 2) == 0);
    if ((bVar18 & 4) != 0) {
      sample->flags = bVar18 & 0xfb;
      iVar10 = iVar10 >> 1;
      uVar1 = sample->loop_start;
      uVar3 = sample->loop_end;
      sample->loop_start = (int)uVar1 >> 1;
      sample->loop_end = (int)uVar3 >> 1;
    }
    psVar14 = dumb_decode_vorbis(iVar10,piVar6 + 1,iVar8 + -4);
    if (psVar14 != (short *)0x0) {
      free(sample->data);
      sample->data = psVar14;
      sample->length = iVar10;
      if ((sample->flags & 2) == 0) {
        sample->flags = sample->flags | 2;
        uVar2 = sample->loop_start;
        uVar4 = sample->loop_end;
        sample->loop_start = uVar2 * 2;
        sample->loop_end = uVar4 * 2;
      }
      it_xm_fixup_sample_points(sample);
      return 0;
    }
  }
  it_xm_fixup_sample_points(sample);
  bVar18 = sample->flags;
  if ((bVar18 & 4) != 0) {
    uVar5 = sample->length;
    pvVar11 = malloc((long)(int)(uVar5 << (2U - ((bVar18 & 2) == 0) & 0x1f)));
    if (pvVar11 != (void *)0x0) {
      sVar19 = 0;
      uVar12 = 0;
      if (0 < (int)uVar5) {
        uVar12 = (ulong)uVar5;
      }
      if ((bVar18 & 2) == 0) {
        sVar19 = 0;
        cVar16 = '\0';
        for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
          pvVar7 = sample->data;
          sVar19 = sVar19 + *(char *)((long)pvVar7 + uVar15);
          *(char *)((long)pvVar11 + uVar15 * 2) = (char)sVar19;
          cVar16 = cVar16 + *(char *)((long)pvVar7 + (long)(int)uVar5 + uVar15);
          *(char *)((long)pvVar11 + uVar15 * 2 + 1) = cVar16;
        }
      }
      else {
        sVar17 = 0;
        for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
          pvVar7 = sample->data;
          sVar19 = sVar19 + *(short *)((long)pvVar7 + uVar15 * 2);
          *(short *)((long)pvVar11 + uVar15 * 4) = sVar19;
          sVar17 = sVar17 + *(short *)((long)pvVar7 + (long)(int)uVar5 * 2 + uVar15 * 2);
          *(short *)((long)pvVar11 + uVar15 * 4 + 2) = sVar17;
        }
      }
      free(sample->data);
      sample->data = pvVar11;
      bVar18 = sample->flags;
      goto LAB_00639b9b;
    }
    bVar18 = bVar18 & 0xfb;
    sample->flags = bVar18;
  }
  sVar19 = 0;
LAB_00639b9b:
  if ((bVar18 & 4) == 0) {
    if ((bVar18 & 2) == 0) {
      for (lVar13 = 0; lVar13 < sample->length; lVar13 = lVar13 + 1) {
        sVar19 = sVar19 + (ushort)*(byte *)((long)sample->data + lVar13);
        *(char *)((long)sample->data + lVar13) = (char)sVar19;
      }
    }
    else {
      uVar12 = (ulong)(uint)sample->length;
      if (sample->length < 1) {
        uVar12 = 0;
      }
      for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
        sVar19 = sVar19 + *(short *)((long)sample->data + uVar15 * 2);
        *(short *)((long)sample->data + uVar15 * 2) = sVar19;
      }
    }
  }
  return 0;
}

Assistant:

static int it_xm_read_sample_data(IT_SAMPLE *sample, unsigned char roguebytes, DUMBFILE *f)
{
	int old;
	int32 i;
//	long truncated_size;
	int n_channels;
	int32 datasizebytes;

	if (!(sample->flags & IT_SAMPLE_EXISTS))
		return dumbfile_skip(f, roguebytes);

#if 0
	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length && roguebytes != 4) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}
#endif
	n_channels = sample->flags & IT_SAMPLE_STEREO ? 2 : 1;
	datasizebytes = sample->length;

	sample->data = malloc(datasizebytes);
	if (!sample->data)
		return -1;

	if (roguebytes == 4)
	{
		if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
			return -1;
		return 0;
	}

	dumbfile_getnc(sample->data, datasizebytes, f);

	if (dumbfile_error(f))
		return -1;

	/* FMOD extension: Samples compressed with Ogg Vorbis */
	if (!memcmp((char *)sample->data + 4, "OggS", 4) &&
		!memcmp((char *)sample->data + 33, "vorbis", 7))
	{
		int32 outlen = ((unsigned char *)(sample->data))[0] |
					  (((unsigned char *)(sample->data))[1] << 8) |
					  (((unsigned char *)(sample->data))[2] << 16) |
					  (((unsigned char *)(sample->data))[3] << 24);
		short *output;

		if (!(sample->flags & IT_SAMPLE_16BIT))
		{
			/* Because it'll be 16-bit when we're done with it. */
			outlen <<= 1;
		}

		if (sample->flags & IT_SAMPLE_STEREO)
		{
			/* OggMod knows nothing of stereo samples and compresses them as mono,
			 * screwing up the second channel. (Because for whatever reason,
			 * ModPlug delta encodes them independantly, even though it presents
			 * the sample as a double-length mono sound to other players.)
			 */
			sample->flags &= ~IT_SAMPLE_STEREO;
			outlen >>= 1;
			sample->loop_start >>= 1;
			sample->loop_end >>= 1;
		}
		output = dumb_decode_vorbis(outlen, (char *)sample->data + 4, datasizebytes - 4);
		if (output != NULL)
		{
			free(sample->data);
			sample->data = output;
			sample->length = outlen;
			if (!(sample->flags & IT_SAMPLE_16BIT))
			{
				sample->flags |= IT_SAMPLE_16BIT;
				sample->loop_start <<= 1;
				sample->loop_end <<= 1;
			}

			it_xm_fixup_sample_points(sample);
			return 0;
		}
		/* Decode failed, so assume it's normal sample data that just so
		 * happened to look like a Vorbis stream. (Not likely to happen
		 * by coincidence!) */
	}

	it_xm_fixup_sample_points(sample);

	/* sample data is stored as signed delta values */
	old = 0;
	if (sample->flags & IT_SAMPLE_STEREO)
	{
		/* Stereo samples are a ModPlug extension, so to keep compatibility with
		 * players that don't know about it (and FastTracker 2 itself), the two
		 * channels are not stored interleaved but rather, one after the other. */
		int old_r = 0;
		void *ibuffer = malloc(sample->length << ((sample->flags & IT_SAMPLE_16BIT) ? 2 : 1));
		if (ibuffer == NULL)
		{
			/* No memory => ignore stereo bits at the end */
			sample->flags &= ~IT_SAMPLE_STEREO;
		}
		else if (sample->flags & IT_SAMPLE_16BIT)
		{
			for (i = 0; i < sample->length; i++)
			{
				((short *)ibuffer)[i*2]   = old += iswapw(((short *)sample->data)[i]);
				((short *)ibuffer)[i*2+1] = old_r += iswapw(((short *)sample->data)[i + sample->length]);
			}
		}
		else
		{
			for (i = 0; i < sample->length; i++)
			{
				((char *)ibuffer)[i*2]   = old += ((char *)sample->data)[i];
				((char *)ibuffer)[i*2+1] = old_r += ((char *)sample->data)[i + sample->length];
			}
		}
		if (ibuffer != NULL)
		{
			free(sample->data);
			sample->data = ibuffer;
		}
	}
	if (!(sample->flags & IT_SAMPLE_STEREO))
	{
		if (sample->flags & IT_SAMPLE_16BIT)
		{
			for (i = 0; i < sample->length; i++)
				((short *)sample->data)[i] = old += iswapw(((short *)sample->data)[i]);
		}
		else
		{
			for (i = 0; i < sample->length; i++)
				((char *)sample->data)[i] = old += ((char *)sample->data)[i];
		}
	}
	return 0;
}